

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O1

Vector3f __thiscall
pbrt::PortalImageInfiniteLight::RenderFromImage
          (PortalImageInfiniteLight *this,Point2f *st,Float *duv_dw)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  Tuple3<pbrt::Vector3,_float> TVar12;
  Vector3f local_48;
  undefined1 local_38 [16];
  float local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined1 extraout_var [60];
  
  auVar6 = vfmadd132ss_fma(ZEXT416((uint)(st->super_Tuple2<pbrt::Point2,_float>).x),
                           SUB6416(ZEXT464(0xbfc90fdb),0),SUB6416(ZEXT464(0x40490fdb),0));
  auVar5 = vfmadd132ss_fma(SUB6416(ZEXT464(0x40490fdb),0),SUB6416(ZEXT464(0xbfc90fdb),0),
                           ZEXT416((uint)(st->super_Tuple2<pbrt::Point2,_float>).y));
  local_38._0_4_ = auVar5._0_4_;
  local_28 = tanf(auVar6._0_4_);
  uStack_24 = extraout_XMM0_Db;
  uStack_20 = extraout_XMM0_Dc;
  uStack_1c = extraout_XMM0_Dd;
  auVar10._0_4_ = tanf((float)local_38._0_4_);
  auVar10._4_60_ = extraout_var;
  auVar6._4_4_ = uStack_24;
  auVar6._0_4_ = local_28;
  auVar6._8_4_ = uStack_20;
  auVar6._12_4_ = uStack_1c;
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * auVar10._0_4_)),auVar6,auVar6);
  fVar7 = auVar6._0_4_ + 1.0;
  if (fVar7 < 0.0) {
    local_38 = auVar10._0_16_;
    fVar7 = sqrtf(fVar7);
    auVar6 = local_38;
  }
  else {
    auVar6 = vsqrtss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
    fVar7 = auVar6._0_4_;
    auVar6 = auVar10._0_16_;
  }
  auVar5._4_4_ = uStack_24;
  auVar5._0_4_ = local_28;
  auVar5._8_4_ = uStack_20;
  auVar5._12_4_ = uStack_1c;
  auVar6 = vinsertps_avx(auVar5,auVar6,0x10);
  auVar11._4_4_ = fVar7;
  auVar11._0_4_ = fVar7;
  auVar11._8_4_ = fVar7;
  auVar11._12_4_ = fVar7;
  auVar6 = vdivps_avx(auVar6,auVar11);
  local_48.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar6);
  uVar1 = vcmpss_avx512f(ZEXT416((uint)(-1.0 / fVar7)),ZEXT816(0) << 0x40,0);
  bVar2 = (bool)((byte)uVar1 & 1);
  local_48.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)((uint)bVar2 * 0x3727c5ac + (uint)!bVar2 * (int)(-1.0 / fVar7));
  if (duv_dw != (Float *)0x0) {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_48.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar3._8_4_ = 0x3f800000;
    auVar3._0_8_ = 0x3f8000003f800000;
    auVar3._12_4_ = 0x3f800000;
    auVar5 = vfnmadd213ps_avx512vl(auVar8,auVar8,auVar3);
    auVar6 = vmovshdup_avx(auVar5);
    auVar9._0_4_ = (auVar6._0_4_ * auVar5._0_4_) / local_48.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar9._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar6 = vandps_avx512vl(auVar9,auVar4);
    *duv_dw = auVar6._0_4_ * 9.869605;
  }
  TVar12 = (Tuple3<pbrt::Vector3,_float>)Frame::FromLocal(&this->portalFrame,&local_48);
  return (Vector3f)TVar12;
}

Assistant:

PBRT_CPU_GPU
    Vector3f RenderFromImage(const Point2f &st, Float *duv_dw = nullptr) const {
        Float alpha = -Pi / 2 + st.x * Pi, beta = -Pi / 2 + st.y * Pi;
        Float x = std::tan(alpha), y = std::tan(beta);
        DCHECK(!IsInf(x) && !IsInf(y));
        Vector3f w = Normalize(Vector3f(x, y, -1));

        if (w.z == 0)
            w.z = 1e-5;
        if (duv_dw)
            *duv_dw = Pi * Pi * std::abs((1 - w.y * w.y) * (1 - w.x * w.x) / w.z);
        return portalFrame.FromLocal(w);
    }